

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,char *project,char *options)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL ref_cell;
  REF_INT RVar2;
  uint uVar3;
  int iVar4;
  REF_STATUS RVar5;
  int iVar6;
  FILE *pFVar7;
  ulong uVar8;
  void *__ptr;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ulong uStackY_8b0;
  REF_INT item;
  REF_INT mark;
  ulong local_890;
  ulong local_888;
  REF_INT new_cell;
  REF_CELL local_878;
  REF_INT new_node;
  REF_INT nnode;
  REF_DBL xyz [3];
  REF_INT node_per;
  REF_INT ntet;
  REF_INT ntri;
  REF_INT attr;
  REF_INT ndim;
  REF_GLOB global;
  REF_INT id;
  REF_INT nodes [27];
  char filename [896];
  char command [1024];
  
  ref_node = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)ref_node->n,
         (ulong)(uint)ref_grid->cell[3]->n);
  snprintf(filename,0x380,"%s-tetgen.poly",project);
  uVar3 = ref_export_by_extension(ref_grid,filename);
  if (uVar3 != 0) {
    pcVar11 = "poly";
    uVar10 = 0x879;
LAB_0014991d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
           "ref_geom_tetgen_volume",(ulong)uVar3,pcVar11);
    return uVar3;
  }
  puts("  The \'S1000\' argument can be added to tetgen options");
  puts("    to cap inserted nodes at 1000 and reduce run time.");
  puts("  The \'q20/10\' arguments (radius-edge-ratio/dihedral-angle)");
  puts("    can be increased for faster initial volume refinement.");
  puts("  The \'O7/7\' arguments (optimization iterations/operation)");
  puts("    can be decreased for faster mesh optimization.");
  puts("  See \'ref bootstrap -h\' for \'--mesher-options\' description");
  puts("    and the TetGen user manual for details.");
  if (options == (char *)0x0) {
    snprintf(command,0x400,"tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",filename,
             project);
  }
  else {
    snprintf(command,0x400,"tetgen %s %s < /dev/null > %s-tetgen.txt",options,filename,project);
  }
  puts(command);
  fflush(_stdout);
  uVar3 = sleep(2);
  if (uVar3 == 0) {
    iVar4 = system(command);
    uVar3 = sleep(2);
    if (uVar3 == 0) {
      if (iVar4 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x896,"ref_geom_tetgen_volume","tetgen failed",0,(long)iVar4);
        puts("tec360 ref_geom_test_tetgen_geom.tec");
        ref_geom_tec(ref_grid,"ref_geom_test_tetgen_geom.tec");
        puts("tec360 ref_geom_test_tetgen_surf.tec");
        ref_export_tec_surf(ref_grid,"ref_geom_test_tetgen_surf.tec");
        return 1;
      }
      snprintf(filename,0x380,"%s-tetgen.1.node",project);
      pFVar7 = fopen(filename,"r");
      if (pFVar7 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar11 = "unable to open file";
        uVar10 = 0x89b;
        goto LAB_00149c1f;
      }
      iVar4 = __isoc99_fscanf(pFVar7,"%d",&nnode);
      if (iVar4 != 1) {
        pcVar11 = "node header nnode";
        uStackY_8b0 = 1;
        uVar10 = 0x89d;
        uVar8 = (long)iVar4;
        goto LAB_00149a7b;
      }
      iVar4 = __isoc99_fscanf(pFVar7,"%d",&ndim);
      if (iVar4 != 1) {
        pcVar11 = "node header ndim";
        uStackY_8b0 = 1;
        uVar10 = 0x89e;
        uVar8 = (long)iVar4;
        goto LAB_00149a7b;
      }
      if ((long)ndim != 3) {
        pcVar11 = "not 3D";
        uStackY_8b0 = 3;
        uVar10 = 0x89f;
        uVar8 = (long)ndim;
        goto LAB_00149a7b;
      }
      iVar4 = __isoc99_fscanf(pFVar7,"%d",&attr);
      if (iVar4 != 1) {
        pcVar11 = "node header attr";
        uStackY_8b0 = 1;
        uVar10 = 0x8a0;
        uVar8 = (long)iVar4;
        goto LAB_00149a7b;
      }
      uVar8 = (ulong)attr;
      if (uVar8 == 0) {
        iVar4 = __isoc99_fscanf(pFVar7,"%d",&mark);
        if (iVar4 != 1) {
          pcVar11 = "node header mark";
          uStackY_8b0 = 1;
          uVar10 = 0x8a2;
          uVar8 = (long)iVar4;
          goto LAB_00149a7b;
        }
        uVar8 = (ulong)mark;
        if (uVar8 == 0) {
          local_890 = (ulong)ref_node->n;
          printf("%d interior nodes\n",(ulong)(uint)(nnode - ref_node->n));
          local_888 = 0;
          if (0 < (int)local_890) {
            local_888 = local_890 & 0xffffffff;
          }
          local_878 = (REF_CELL)0x10;
          for (uVar8 = 0; local_888 != uVar8; uVar8 = uVar8 + 1) {
            iVar4 = __isoc99_fscanf(pFVar7,"%d",&item);
            if (iVar4 != 1) {
              pcVar11 = "node item";
              uStackY_8b0 = 1;
              uVar10 = 0x8ab;
              uVar8 = (long)iVar4;
              goto LAB_00149a7b;
            }
            if (uVar8 != (uint)item) {
              pcVar11 = "node index";
              uVar10 = 0x8ac;
              goto LAB_0014a198;
            }
            iVar4 = __isoc99_fscanf(pFVar7,"%lf",xyz);
            if (iVar4 != 1) {
              pcVar11 = "x";
              uVar10 = 0x8ad;
              goto LAB_0014a198;
            }
            iVar4 = __isoc99_fscanf(pFVar7,"%lf",xyz + 1);
            if (iVar4 != 1) {
              pcVar11 = "y";
              uVar10 = 0x8ae;
              goto LAB_0014a198;
            }
            iVar4 = __isoc99_fscanf(pFVar7,"%lf",xyz + 2);
            if (iVar4 != 1) {
              pcVar11 = "z";
              uVar10 = 0x8af;
              goto LAB_0014a198;
            }
            pRVar1 = ref_node->real;
            dVar14 = xyz[0] - *(double *)((long)(pRVar1 + -2) + (long)local_878);
            dVar15 = xyz[1] - *(double *)((long)(pRVar1 + -1) + (long)local_878);
            dVar16 = xyz[2] - *(double *)((long)pRVar1 + (long)local_878);
            if (1e-12 < SQRT(dVar16 * dVar16 + dVar14 * dVar14 + dVar15 * dVar15)) {
              printf("node %d off by %e\n",uVar8);
              pcVar11 = "tetgen moved node";
              uVar10 = 0x8b8;
              goto LAB_0014a198;
            }
            local_878 = (REF_CELL)&local_878[1].blank;
          }
          for (; (long)local_890 < (long)nnode; local_890 = local_890 + 1) {
            iVar4 = __isoc99_fscanf(pFVar7,"%d",&item);
            RVar2 = item;
            if (iVar4 != 1) {
              pcVar11 = "node item";
              uStackY_8b0 = 1;
              uVar10 = 0x8be;
              uVar8 = (long)iVar4;
              goto LAB_00149a7b;
            }
            uVar8 = (ulong)item;
            if ((int)local_890 != item) {
              pcVar11 = "file node index";
              uVar10 = 0x8bf;
              uStackY_8b0 = local_890;
              goto LAB_00149a7b;
            }
            uVar3 = ref_node_next_global(ref_node,&global);
            if (uVar3 != 0) {
              pcVar11 = "next global";
              uVar10 = 0x8c0;
              goto LAB_0014991d;
            }
            if (local_890 != global) {
              pcVar11 = "global node index";
              uVar10 = 0x8c1;
              uStackY_8b0 = local_890;
              uVar8 = global;
              goto LAB_00149a7b;
            }
            uVar3 = ref_node_add(ref_node,local_890,&new_node);
            if (uVar3 != 0) {
              pcVar11 = "new_node";
              uVar10 = 0x8c2;
              goto LAB_0014991d;
            }
            if (RVar2 != new_node) {
              pcVar11 = "node index";
              uVar10 = 0x8c3;
              goto LAB_0014a198;
            }
            iVar4 = __isoc99_fscanf(pFVar7,"%lf",xyz);
            if (iVar4 != 1) {
              pcVar11 = "x";
              uVar10 = 0x8c4;
              goto LAB_0014a198;
            }
            iVar4 = __isoc99_fscanf(pFVar7,"%lf",xyz + 1);
            if (iVar4 != 1) {
              pcVar11 = "y";
              uVar10 = 0x8c5;
              goto LAB_0014a198;
            }
            iVar4 = __isoc99_fscanf(pFVar7,"%lf",xyz + 2);
            if (iVar4 != 1) {
              pcVar11 = "z";
              uVar10 = 0x8c6;
              goto LAB_0014a198;
            }
            pRVar1 = ref_node->real;
            lVar12 = (long)new_node;
            pRVar1[lVar12 * 0xf] = xyz[0];
            pRVar1[lVar12 * 0xf + 1] = xyz[1];
            pRVar1[lVar12 * 0xf + 2] = xyz[2];
          }
          fclose(pFVar7);
          snprintf(filename,0x380,"%s-tetgen.1.face");
          pFVar7 = fopen(filename,"r");
          if (pFVar7 == (FILE *)0x0) {
            printf("unable to open %s\n",filename);
            pcVar11 = "unable to open file";
            uVar10 = 0x8d3;
            goto LAB_00149c1f;
          }
          iVar4 = __isoc99_fscanf(pFVar7,"%d",&ntri);
          if (iVar4 != 1) {
            pcVar11 = "face header ntri";
            uStackY_8b0 = 1;
            uVar10 = 0x8d4;
            uVar8 = (long)iVar4;
            goto LAB_00149a7b;
          }
          iVar4 = __isoc99_fscanf(pFVar7,"%d",&mark);
          if (iVar4 != 1) {
            pcVar11 = "face header mark";
            uStackY_8b0 = 1;
            uVar10 = 0x8d5;
            uVar8 = (long)iVar4;
            goto LAB_00149a7b;
          }
          if ((long)mark != 1) {
            pcVar11 = "face have mark";
            uStackY_8b0 = 1;
            uVar10 = 0x8d6;
            uVar8 = (long)mark;
            goto LAB_00149a7b;
          }
          local_878 = ref_grid->cell[3];
          lVar12 = (long)local_878->max;
          if (lVar12 < 0) {
            pcVar11 = "malloc position of REF_INT negative";
            uVar10 = 0x8d9;
LAB_0014a198:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar10,"ref_geom_tetgen_volume",pcVar11);
            return 1;
          }
          __ptr = malloc(lVar12 * 4);
          if (__ptr == (void *)0x0) {
            pcVar11 = "malloc position of REF_INT NULL";
            uVar10 = 0x8d9;
LAB_00149c1f:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar10,"ref_geom_tetgen_volume",pcVar11);
            return 2;
          }
          for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 1) {
            *(undefined4 *)((long)__ptr + lVar9 * 4) = 0xffffffff;
          }
          local_890 = local_890 & 0xffffffff00000000;
          local_888 = local_888 & 0xffffffff00000000;
          while ((int)local_888 < ntri) {
            iVar4 = __isoc99_fscanf(pFVar7,"%d",&item);
            if (iVar4 != 1) {
              lVar12 = (long)iVar4;
              pcVar11 = "tri item";
              uStackY_8b0 = 1;
              uVar10 = 0x8db;
              goto LAB_0014a6be;
            }
            if ((int)local_888 != item) {
              pcVar11 = "tri index";
              uVar10 = 0x8dc;
              goto LAB_0014a564;
            }
            lVar12 = 0;
            while (lVar12 + 4 != 0x10) {
              iVar4 = __isoc99_fscanf(pFVar7,"%d",(long)nodes + lVar12);
              lVar12 = lVar12 + 4;
              if (iVar4 != 1) {
                pcVar11 = "tri";
                uVar10 = 0x8de;
                goto LAB_0014a564;
              }
            }
            if ((mark == 1) && (iVar4 = __isoc99_fscanf(pFVar7,"%d",&id), iVar4 != 1)) {
              lVar12 = (long)iVar4;
              pcVar11 = "tri mark id";
              uStackY_8b0 = 1;
              uVar10 = 0x8df;
              goto LAB_0014a6be;
            }
            RVar5 = ref_cell_with(local_878,nodes,&new_cell);
            if (RVar5 == 0) {
              *(int *)((long)__ptr + (long)new_cell * 4) = (int)local_888;
            }
            else {
              ref_node_location(ref_node,nodes[0]);
              ref_node_location(ref_node,nodes[1]);
              ref_node_location(ref_node,nodes[2]);
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x8e7,"ref_geom_tetgen_volume","tetgen face tri not found in ref_grid");
              local_890 = CONCAT44(local_890._4_4_,1);
            }
            local_888 = CONCAT44(local_888._4_4_,(int)local_888 + 1);
          }
          for (local_888 = 0; (long)local_888 < (long)local_878->max; local_888 = local_888 + 1) {
            RVar5 = ref_cell_nodes(local_878,(REF_INT)local_888,nodes);
            if ((RVar5 == 0) && (*(int *)((long)__ptr + local_888 * 4) == -1)) {
              ref_node_location(ref_node,nodes[0]);
              ref_node_location(ref_node,nodes[1]);
              ref_node_location(ref_node,nodes[2]);
              printf("face id %d\n",(ulong)(uint)nodes[3]);
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x8f1,"ref_geom_tetgen_volume","ref_grid tri not found in tetgen face");
              local_890 = CONCAT44(local_890._4_4_,1);
            }
          }
          free(__ptr);
          if ((int)local_890 == 0) {
            fclose(pFVar7);
            snprintf(filename,0x380,"%s-tetgen.1.ele");
            pFVar7 = fopen(filename,"r");
            if (pFVar7 == (FILE *)0x0) {
              printf("unable to open %s\n",filename);
              pcVar11 = "unable to open file";
              uVar10 = 0x8fc;
              goto LAB_00149c1f;
            }
            iVar4 = __isoc99_fscanf(pFVar7,"%d",&ntet);
            if (iVar4 == 1) {
              iVar4 = __isoc99_fscanf(pFVar7,"%d",&node_per);
              if (iVar4 == 1) {
                lVar12 = (long)node_per;
                if (lVar12 == 4) {
                  iVar4 = __isoc99_fscanf(pFVar7,"%d",&mark);
                  if (iVar4 == 1) {
                    lVar12 = (long)mark;
                    if (lVar12 == 0) {
                      ref_cell = ref_grid->cell[8];
                      iVar4 = 0;
                      do {
                        if (ntet <= iVar4) {
                          fclose(pFVar7);
                          ref_grid->surf = 0;
                          snprintf(filename,0x380,"%s-tetgen.1.edge",project);
                          iVar4 = remove(filename);
                          if (iVar4 == 0) {
                            snprintf(filename,0x380,"%s-tetgen.1.face",project);
                            iVar4 = remove(filename);
                            if (iVar4 == 0) {
                              snprintf(filename,0x380,"%s-tetgen.1.node",project);
                              iVar4 = remove(filename);
                              if (iVar4 == 0) {
                                snprintf(filename,0x380,"%s-tetgen.1.ele",project);
                                iVar4 = remove(filename);
                                if (iVar4 == 0) {
                                  snprintf(filename,0x380,"%s-tetgen.poly",project);
                                  iVar4 = remove(filename);
                                  if (iVar4 == 0) {
                                    return 0;
                                  }
                                  lVar12 = (long)iVar4;
                                  pcVar11 = "rm .poly tetgen input file";
                                  uVar10 = 0x91c;
                                }
                                else {
                                  lVar12 = (long)iVar4;
                                  pcVar11 = "rm .1.ele tetgen output file";
                                  uVar10 = 0x91a;
                                }
                              }
                              else {
                                lVar12 = (long)iVar4;
                                pcVar11 = "rm .1.node tetgen output file";
                                uVar10 = 0x918;
                              }
                            }
                            else {
                              lVar12 = (long)iVar4;
                              pcVar11 = "rm .1.face tetgen output file";
                              uVar10 = 0x916;
                            }
                          }
                          else {
                            lVar12 = (long)iVar4;
                            pcVar11 = "rm .1.edge tetgen output file";
                            uVar10 = 0x914;
                          }
                          goto LAB_0014a7d5;
                        }
                        iVar6 = __isoc99_fscanf(pFVar7,"%d",&item);
                        if (iVar6 != 1) {
                          lVar12 = (long)iVar6;
                          pcVar11 = "tet item";
                          uStackY_8b0 = 1;
                          uVar10 = 0x906;
                          goto LAB_0014a6be;
                        }
                        if (iVar4 != item) {
                          pcVar11 = "tet index";
                          uVar10 = 0x907;
                          goto LAB_0014a564;
                        }
                        lVar12 = 0;
                        while (lVar12 + 4 != 0x14) {
                          iVar6 = __isoc99_fscanf(pFVar7,"%d",(long)nodes + lVar12);
                          lVar12 = lVar12 + 4;
                          if (iVar6 != 1) {
                            pcVar11 = "tet";
                            uVar10 = 0x909;
                            goto LAB_0014a564;
                          }
                        }
                        uVar3 = ref_cell_add(ref_cell,nodes,&new_cell);
                        if (uVar3 != 0) {
                          pcVar11 = "new tet";
                          uVar10 = 0x90a;
                          goto LAB_0014991d;
                        }
                        bVar13 = iVar4 == new_cell;
                        iVar4 = iVar4 + 1;
                      } while (bVar13);
                      pcVar11 = "tet index";
                      uVar10 = 0x90b;
                      goto LAB_0014a564;
                    }
                    pcVar11 = "ele have mark";
                    uVar10 = 0x902;
LAB_0014a7d5:
                    uStackY_8b0 = 0;
                  }
                  else {
                    lVar12 = (long)iVar4;
                    pcVar11 = "ele header mark";
                    uStackY_8b0 = 1;
                    uVar10 = 0x901;
                  }
                }
                else {
                  pcVar11 = "expected tets";
                  uStackY_8b0 = 4;
                  uVar10 = 0x900;
                }
              }
              else {
                lVar12 = (long)iVar4;
                pcVar11 = "ele header node_per";
                uStackY_8b0 = 1;
                uVar10 = 0x8ff;
              }
            }
            else {
              lVar12 = (long)iVar4;
              pcVar11 = "ele header ntet";
              uStackY_8b0 = 1;
              uVar10 = 0x8fe;
            }
LAB_0014a6be:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar10,"ref_geom_tetgen_volume",pcVar11,uStackY_8b0,lVar12);
          }
          else {
            pcVar11 = "problem detected in tetgen triangles";
            uVar10 = 0x8f5;
LAB_0014a564:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar10,"ref_geom_tetgen_volume",pcVar11);
          }
          return 1;
        }
        pcVar11 = "nodes have mark";
        uVar10 = 0x8a3;
      }
      else {
        pcVar11 = "nodes have attribute 3D";
        uVar10 = 0x8a1;
      }
    }
    else {
      uVar8 = (ulong)uVar3;
      pcVar11 = "sleep failed";
      uVar10 = 0x890;
    }
  }
  else {
    uVar8 = (ulong)uVar3;
    pcVar11 = "sleep failed";
    uVar10 = 0x88e;
  }
  uStackY_8b0 = 0;
LAB_00149a7b:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
         "ref_geom_tetgen_volume",pcVar11,uStackY_8b0,uVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,
                                          const char *project,
                                          const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  char filename[896];
  char command[1024];
  FILE *file;
  REF_INT nnode, ndim, attr, mark;
  REF_GLOB global;
  REF_INT ntri, ntet, node_per, id;
  REF_INT node, nnode_surface, item, new_node;
  REF_DBL xyz[3], dist;
  REF_INT cell, new_cell, nodes[REF_CELL_MAX_SIZE_PER];
  int system_status;
  REF_BOOL delete_temp_files = REF_TRUE;
  REF_BOOL problem;
  REF_BOOL *position;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 896, "%s-tetgen.poly", project);
  RSS(ref_export_by_extension(ref_grid, filename), "poly");

  printf("  The 'S1000' argument can be added to tetgen options\n");
  printf("    to cap inserted nodes at 1000 and reduce run time.\n");
  printf("  The 'q20/10' arguments (radius-edge-ratio/dihedral-angle)\n");
  printf("    can be increased for faster initial volume refinement.\n");
  printf("  The 'O7/7' arguments (optimization iterations/operation)\n");
  printf("    can be decreased for faster mesh optimization.\n");
  printf("  See 'ref bootstrap -h' for '--mesher-options' description\n");
  printf("    and the TetGen user manual for details.\n");

  if (NULL == options) {
    snprintf(command, 1024,
             "tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",
             filename, project);
  } else {
    snprintf(command, 1024, "tetgen %s %s < /dev/null > %s-tetgen.txt", options,
             filename, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  REIS(0, sleep(2), "sleep failed");
  system_status = system(command);
  REIS(0, sleep(2), "sleep failed");
  REIB(0, system_status, "tetgen failed", {
    printf("tec360 ref_geom_test_tetgen_geom.tec\n");
    ref_geom_tec(ref_grid, "ref_geom_test_tetgen_geom.tec");
    printf("tec360 ref_geom_test_tetgen_surf.tec\n");
    ref_export_tec_surf(ref_grid, "ref_geom_test_tetgen_surf.tec");
  });

  snprintf(filename, 896, "%s-tetgen.1.node", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &nnode), "node header nnode");
  REIS(1, fscanf(file, "%d", &ndim), "node header ndim");
  REIS(3, ndim, "not 3D");
  REIS(1, fscanf(file, "%d", &attr), "node header attr");
  REIS(0, attr, "nodes have attribute 3D");
  REIS(1, fscanf(file, "%d", &mark), "node header mark");
  REIS(0, mark, "nodes have mark");

  /* verify surface nodes */
  nnode_surface = ref_node_n(ref_node);

  printf("%d interior nodes\n", nnode - nnode_surface);

  for (node = 0; node < nnode_surface; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    RES(node, item, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    dist = sqrt((xyz[0] - ref_node_xyz(ref_node, 0, node)) *
                    (xyz[0] - ref_node_xyz(ref_node, 0, node)) +
                (xyz[1] - ref_node_xyz(ref_node, 1, node)) *
                    (xyz[1] - ref_node_xyz(ref_node, 1, node)) +
                (xyz[2] - ref_node_xyz(ref_node, 2, node)) *
                    (xyz[2] - ref_node_xyz(ref_node, 2, node)));
    if (dist > 1.0e-12) {
      printf("node %d off by %e\n", node, dist);
      THROW("tetgen moved node");
    }
  }

  /* interior nodes */
  for (node = nnode_surface; node < nnode; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    REIS(node, item, "file node index");
    RSS(ref_node_next_global(ref_node, &global), "next global");
    REIS(node, global, "global node index");
    RSS(ref_node_add(ref_node, global, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }

  fclose(file);

  /* check .1.face when paranoid, but tetgen -z should not mess with them */
  problem = REF_FALSE;
  snprintf(filename, 896, "%s-tetgen.1.face", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");
  REIS(1, fscanf(file, "%d", &ntri), "face header ntri");
  REIS(1, fscanf(file, "%d", &mark), "face header mark");
  REIS(1, mark, "face have mark");

  ref_cell = ref_grid_tri(ref_grid);
  ref_malloc_init(position, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  for (cell = 0; cell < ntri; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tri item");
    RES(cell, item, "tri index");
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    if (1 == mark) REIS(1, fscanf(file, "%d", &id), "tri mark id");
    if (REF_SUCCESS == ref_cell_with(ref_cell, nodes, &new_cell)) {
      position[new_cell] = cell;
    } else {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      REF_WHERE("tetgen face tri not found in ref_grid");
    }
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY == position[cell]) {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      printf("face id %d\n", nodes[3]);
      REF_WHERE("ref_grid tri not found in tetgen face");
    }
  }
  ref_free(position);
  RAS(!problem, "problem detected in tetgen triangles");

  fclose(file);

  snprintf(filename, 896, "%s-tetgen.1.ele", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &ntet), "ele header ntet");
  REIS(1, fscanf(file, "%d", &node_per), "ele header node_per");
  REIS(4, node_per, "expected tets");
  REIS(1, fscanf(file, "%d", &mark), "ele header mark");
  REIS(0, mark, "ele have mark");

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tet item");
    RES(cell, item, "tet index");
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  ref_grid_surf(ref_grid) = REF_FALSE;

  if (delete_temp_files) {
    snprintf(filename, 896, "%s-tetgen.1.edge", project);
    REIS(0, remove(filename), "rm .1.edge tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.face", project);
    REIS(0, remove(filename), "rm .1.face tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.node", project);
    REIS(0, remove(filename), "rm .1.node tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.ele", project);
    REIS(0, remove(filename), "rm .1.ele tetgen output file");
    snprintf(filename, 896, "%s-tetgen.poly", project);
    REIS(0, remove(filename), "rm .poly tetgen input file");
  }

  return REF_SUCCESS;
}